

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

Own<kj::AsyncIoStream,_std::nullptr_t> __thiscall
kj::HttpServer::Connection::getConnectStream(Connection *this)

{
  _func_int *p_Var1;
  _func_int *p_Var2;
  _func_int **pp_Var3;
  _func_int **pp_Var4;
  _func_int **pp_Var5;
  OwnPromiseNode node;
  PromiseBase node_00;
  Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_> *pMVar6;
  WeakFulfiller<void> *params;
  AsyncIoStream *pAVar7;
  Disposer *pDVar8;
  AsyncIoStreamWithGuards *this_00;
  AsyncIoStream *extraout_RDX;
  AsyncIoStream *extraout_RDX_00;
  AsyncIoStream *extraout_RDX_01;
  AsyncIoStream *extraout_RDX_02;
  AsyncIoStream *extraout_RDX_03;
  AsyncIoStream *extraout_RDX_04;
  _func_int **in_RSI;
  _func_int **pp_Var9;
  AsyncIoStreamWithInitialBuffer *ptrCopy;
  Own<kj::AsyncIoStream,_std::nullptr_t> OVar10;
  OwnPromiseNode local_118;
  PromiseBase local_110;
  AsyncIoStream *ptrCopy_1;
  Own<kj::AsyncIoStream,_std::nullptr_t> local_100;
  _func_int **local_f0;
  DebugComparison<kj::Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>_&,_const_kj::None_&>
  _kjCondition;
  ReleasedBuffer releasedBuffer;
  Fault f;
  anon_union_40_1_a8c68091_for_NullableValue<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>_2
  local_70;
  
  _kjCondition.left = (Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_> *)(in_RSI + 0x31)
  ;
  _kjCondition.result = in_RSI[0x32] == (_func_int *)0x0;
  _kjCondition.right = (None *)&kj::none;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if (_kjCondition.result) {
    params = (WeakFulfiller<void> *)operator_new(0x18);
    (params->super_WeakFulfillerBase).inner = (PromiseRejector *)0x0;
    (params->super_PromiseFulfiller<void>).super_PromiseRejector._vptr_PromiseRejector =
         (_func_int **)&PTR_reject_006b66f0;
    (params->super_WeakFulfillerBase).super_Disposer._vptr_Disposer =
         (_func_int **)&PTR_disposeImpl_006b6728;
    kj::_::PromiseDisposer::
    alloc<kj::_::AdapterPromiseNode<kj::_::Void,kj::_::PromiseAndFulfillerAdapter<void>>,kj::_::PromiseDisposer,kj::_::WeakFulfiller<void>&>
              ((PromiseDisposer *)&_kjCondition,params);
    pMVar6 = _kjCondition.left;
    p_Var1 = in_RSI[0x31];
    p_Var2 = in_RSI[0x32];
    in_RSI[0x31] = (_func_int *)&params->super_WeakFulfillerBase;
    in_RSI[0x32] = (_func_int *)params;
    if (p_Var2 != (_func_int *)0x0) {
      (*(code *)**(undefined8 **)p_Var1)(p_Var1,p_Var2 + *(long *)(*(long *)p_Var2 + -0x10));
    }
    pp_Var3 = (_func_int **)in_RSI[0xc];
    if (pp_Var3 == (_func_int **)0x0) {
      local_f0 = (_func_int **)0x0;
      pp_Var9 = (_func_int **)0x0;
    }
    else {
      pp_Var9 = (_func_int **)in_RSI[10];
      local_f0 = (_func_int **)in_RSI[0xb];
      in_RSI[10] = (_func_int *)0x0;
      in_RSI[0xb] = (_func_int *)0x0;
    }
    ptrCopy_1 = (AsyncIoStream *)in_RSI[4];
    pp_Var4 = (_func_int **)in_RSI[0xe];
    pp_Var5 = (_func_int **)in_RSI[0xf];
    pAVar7 = (AsyncIoStream *)operator_new(0x48);
    (pAVar7->super_AsyncInputStream)._vptr_AsyncInputStream = (_func_int **)&PTR_read_006db678;
    (pAVar7->super_AsyncOutputStream)._vptr_AsyncOutputStream = (_func_int **)&PTR_write_006db718;
    pAVar7[1].super_AsyncInputStream._vptr_AsyncInputStream = (_func_int **)&NullDisposer::instance;
    pAVar7[1].super_AsyncOutputStream._vptr_AsyncOutputStream = (_func_int **)ptrCopy_1;
    pAVar7[2].super_AsyncInputStream._vptr_AsyncInputStream = pp_Var9;
    pAVar7[2].super_AsyncOutputStream._vptr_AsyncOutputStream = local_f0;
    pAVar7[3].super_AsyncInputStream._vptr_AsyncInputStream = pp_Var3;
    pAVar7[3].super_AsyncOutputStream._vptr_AsyncOutputStream = pp_Var4;
    pAVar7[4].super_AsyncInputStream._vptr_AsyncInputStream = pp_Var5;
    pDVar8 = (Disposer *)operator_new(0x28);
    *(undefined1 *)&pDVar8[1]._vptr_Disposer = 1;
    pDVar8[2]._vptr_Disposer = in_RSI;
    pDVar8[3]._vptr_Disposer =
         (_func_int **)&kj::_::HeapDisposer<kj::AsyncIoStreamWithInitialBuffer>::instance;
    pDVar8[4]._vptr_Disposer = (_func_int **)pAVar7;
    pDVar8->_vptr_Disposer = (_func_int **)&PTR_disposeImpl_006db8a0;
    f.exception._0_1_ = '\0';
    this_00 = (AsyncIoStreamWithGuards *)operator_new(0x88);
    local_100.disposer = pDVar8;
    local_100.ptr = pAVar7;
    Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>::Maybe
              ((Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer> *)
               &_kjCondition,
               (Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer> *)&f);
    Promise<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>_>::Promise
              ((Promise<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>_>
                *)&local_118,
               (FixVoid<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>_>
                *)&_kjCondition);
    local_110.node.ptr = (OwnPromiseNode)(OwnPromiseNode)pMVar6;
    AsyncIoStreamWithGuards::AsyncIoStreamWithGuards
              (this_00,&local_100,
               (Promise<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>_>
                *)&local_118,(Promise<void> *)&local_110);
    node_00.node.ptr = local_110.node.ptr;
    pAVar7 = extraout_RDX;
    if (local_110.node.ptr != (PromiseNode *)0x0) {
      local_110.node.ptr = (OwnPromiseNode)(PromiseNode *)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node_00.node.ptr);
      pAVar7 = extraout_RDX_00;
    }
    node.ptr = local_118.ptr;
    if (&(local_118.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
      local_118.ptr = (PromiseNode *)0x0;
      kj::_::PromiseDisposer::dispose(&(node.ptr)->super_PromiseArenaMember);
      pAVar7 = extraout_RDX_01;
    }
    if (((char)_kjCondition.left == '\x01') && (_kjCondition.right != (None *)0x0)) {
      (*(code *)**(undefined8 **)_kjCondition.op.content.size_)
                (_kjCondition.op.content.size_,_kjCondition.right,1,_kjCondition.op.content.ptr,
                 _kjCondition.op.content.ptr,0);
      pAVar7 = extraout_RDX_02;
    }
    if (local_100.ptr != (AsyncIoStream *)0x0) {
      (**(local_100.disposer)->_vptr_Disposer)
                (local_100.disposer,
                 ((local_100.ptr)->super_AsyncInputStream)._vptr_AsyncInputStream[-2] +
                 (long)&((local_100.ptr)->super_AsyncInputStream)._vptr_AsyncInputStream);
      pAVar7 = extraout_RDX_03;
    }
    (this->super_Response)._vptr_Response =
         (_func_int **)&kj::_::HeapDisposer<kj::AsyncIoStreamWithGuards>::instance;
    (this->super_ConnectResponse)._vptr_ConnectResponse = (_func_int **)this_00;
    if (((char)f.exception == '\x01') && (local_70.value.buffer.ptr != (uchar *)0x0)) {
      (**(local_70.value.buffer.disposer)->_vptr_ArrayDisposer)
                (local_70.value.buffer.disposer,local_70.value.buffer.ptr,1,
                 local_70.value.buffer.size_,local_70.value.buffer.size_,0);
      pAVar7 = extraout_RDX_04;
    }
    OVar10.ptr = pAVar7;
    OVar10.disposer = (Disposer *)this;
    return OVar10;
  }
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<kj::Maybe<kj::Own<kj::PromiseFulfiller<void>,decltype(nullptr)>>&,kj::None_const&>&,char_const(&)[40]>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
             ,0x1f89,FAILED,"tunnelWriteGuard == kj::none",
             "_kjCondition,\"the tunnel stream was already retrieved\"",&_kjCondition,
             (char (*) [40])"the tunnel stream was already retrieved");
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

kj::Own<kj::AsyncIoStream> getConnectStream() {
    // Returns an AsyncIoStream over the internal stream but that waits for a Promise to be
    // resolved to allow writes after either accept or reject are called. Reads are allowed
    // immediately.
    KJ_REQUIRE(tunnelWriteGuard == kj::none, "the tunnel stream was already retrieved");
    auto paf = kj::newPromiseAndFulfiller<void>();
    tunnelWriteGuard = kj::mv(paf.fulfiller);

    kj::Own<kj::AsyncIoStream> ownStream(&stream, kj::NullDisposer::instance);
    auto releasedBuffer = httpInput.releaseBuffer();
    auto deferNoteClosed = kj::defer([this]() { webSocketOrConnectClosed = true; });
    return kj::heap<AsyncIoStreamWithGuards>(
        kj::heap<AsyncIoStreamWithInitialBuffer>(
            kj::mv(ownStream),
            kj::mv(releasedBuffer.buffer),
            releasedBuffer.leftover).attach(kj::mv(deferNoteClosed)),
        kj::Maybe<HttpInputStreamImpl::ReleasedBuffer>(kj::none),
        kj::mv(paf.promise));
  }